

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckStructure.cpp
# Opt level: O1

bool __thiscall CheckStructure::isOpenedPar(CheckStructure *this,string *ch)

{
  pointer pbVar1;
  size_t __n;
  int iVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pbVar1 = (this->delimiters).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __n = ch->_M_string_length;
  if (__n == pbVar1->_M_string_length) {
    if (__n == 0) {
      return true;
    }
    iVar2 = bcmp((ch->_M_dataplus)._M_p,(pbVar1->_M_dataplus)._M_p,__n);
    if (iVar2 == 0) {
      return true;
    }
  }
  if ((__n == pbVar1[5]._M_string_length) &&
     ((__n == 0 || (iVar2 = bcmp((ch->_M_dataplus)._M_p,pbVar1[5]._M_dataplus._M_p,__n), iVar2 == 0)
      ))) {
    this->m_countCalls = this->m_countCalls + 1;
    bVar3 = true;
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"wrong char instead of open parentness","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->m_errors,
               &local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool CheckStructure::isOpenedPar(string ch) {
    if (ch == delimiters[0])
        return true;
    if (ch == delimiters[5]) {
        m_countCalls++;
        return true;
    }
    m_errors.push_back("wrong char instead of open parentness");
    return false;
}